

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::compiler::SCC_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
::begin(raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::compiler::SCC_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
        *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ctrl_t *ctrl;
  ulong extraout_RDX;
  iterator iVar3;
  iterator local_18;
  
  bVar2 = empty(this);
  if (bVar2) {
    AssertNotDebugCapacity(this);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = extraout_RDX;
    iVar3 = (iterator)(auVar1 << 0x40);
  }
  else {
    bVar2 = is_soo(this);
    if (bVar2) {
      iVar3 = soo_iterator(this);
    }
    else {
      ctrl = control(this);
      iterator::iterator(&local_18,ctrl,
                         (this->settings_).
                         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                         .
                         super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                         .value.heap_or_soo_.heap.slot_array,(GenerationType *)0x0);
      iterator::skip_empty_or_deleted(&local_18);
      if (*local_18.ctrl_ < ~kSentinel) {
        __assert_fail("(IsFull(*it.control())) && \"Try enabling sanitizers.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xb58,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::compiler::SCC *>, absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Hash, absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Eq, std::allocator<const google::protobuf::compiler::SCC *>>::begin() [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::compiler::SCC *>, Hash = absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::compiler::SCC *>::Eq, Alloc = std::allocator<const google::protobuf::compiler::SCC *>]"
                     );
      }
      iVar3.field_1.slot_ = local_18.field_1.slot_;
      iVar3.ctrl_ = local_18.ctrl_;
    }
  }
  return iVar3;
}

Assistant:

iterator begin() ABSL_ATTRIBUTE_LIFETIME_BOUND {
    if (ABSL_PREDICT_FALSE(empty())) return end();
    if (is_soo()) return soo_iterator();
    iterator it = {control(), common().slots_union(),
                   common().generation_ptr()};
    it.skip_empty_or_deleted();
    ABSL_SWISSTABLE_ASSERT(IsFull(*it.control()));
    return it;
  }